

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

bool __thiscall Minisat::Solver::simplifyAll(Solver *this)

{
  bool bVar1;
  CRef CVar2;
  
  reset_old_trail(this);
  this->simplified_length_record = 0;
  this->original_length_record = 0;
  cancelUntil(this,0,false);
  if ((((this->ok == true) && (CVar2 = propagate(this), CVar2 == 0xffffffff)) &&
      (bVar1 = simplifyLearnt(this,&this->learnts_core,false), bVar1)) &&
     (bVar1 = simplifyLearnt(this,&this->learnts_tier2,true), bVar1)) {
    if ((double)(this->ca).super_RegionAllocator<unsigned_int>.wasted_ <=
        (double)(this->ca).super_RegionAllocator<unsigned_int>.sz * this->garbage_frac) {
      return true;
    }
    (*this->_vptr_Solver[2])(this);
    return true;
  }
  this->ok = false;
  return false;
}

Assistant:

bool Solver::simplifyAll()
{
    reset_old_trail();

    ////
    simplified_length_record = original_length_record = 0;

    // make sure we have no decisions left due to partial restarts
    cancelUntil(0);

    if (!ok || propagate() != CRef_Undef) return ok = false;

    assert(decisionLevel() == 0 && "LCM works only on level 0");

    if (!simplifyLearnt(learnts_core, false)) return ok = false;
    if (!simplifyLearnt(learnts_tier2, true)) return ok = false;

    checkGarbage();

    ////
    //  printf("c size_reduce_ratio     : %4.2f%%\n",
    //         original_length_record == 0 ? 0 : (original_length_record - simplified_length_record) * 100 / (double)original_length_record);

    return true;
}